

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O0

shared_ptr<QPDFFileSpecObjectHelper> __thiscall
QPDFEmbeddedFileDocumentHelper::getEmbeddedFile(QPDFEmbeddedFileDocumentHelper *this,string *name)

{
  bool bVar1;
  __shared_ptr *this_00;
  __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<QPDFFileSpecObjectHelper> sVar5;
  QPDFObjectHandle local_d8;
  iterator local_c8;
  undefined1 local_70 [8];
  iterator i;
  string *name_local;
  QPDFEmbeddedFileDocumentHelper *this_local;
  shared_ptr<QPDFFileSpecObjectHelper> *result;
  
  i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  std::shared_ptr<QPDFFileSpecObjectHelper>::shared_ptr
            ((shared_ptr<QPDFFileSpecObjectHelper> *)this);
  this_00 = (__shared_ptr *)
            std::
            __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(name->field_2)._M_local_buf);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
  _Var4._M_pi = extraout_RDX;
  if (bVar1) {
    p_Var2 = (__shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)(name->field_2)._M_local_buf);
    peVar3 = std::
             __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var2);
    QPDFNameTreeObjectHelper::find((iterator *)local_70,peVar3,in_RDX,false);
    p_Var2 = (__shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)(name->field_2)._M_local_buf);
    peVar3 = std::
             __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var2);
    QPDFNameTreeObjectHelper::end(&local_c8,peVar3);
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=((iterator *)local_70,&local_c8);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_c8);
    if (bVar1) {
      QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_((iterator *)local_70);
      std::make_shared<QPDFFileSpecObjectHelper,QPDFObjectHandle&>(&local_d8);
      std::shared_ptr<QPDFFileSpecObjectHelper>::operator=
                ((shared_ptr<QPDFFileSpecObjectHelper> *)this,
                 (shared_ptr<QPDFFileSpecObjectHelper> *)&local_d8);
      std::shared_ptr<QPDFFileSpecObjectHelper>::~shared_ptr
                ((shared_ptr<QPDFFileSpecObjectHelper> *)&local_d8);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_70);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<QPDFFileSpecObjectHelper>)
         sVar5.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFFileSpecObjectHelper>
QPDFEmbeddedFileDocumentHelper::getEmbeddedFile(std::string const& name)
{
    std::shared_ptr<QPDFFileSpecObjectHelper> result;
    if (m->embedded_files) {
        auto i = m->embedded_files->find(name);
        if (i != m->embedded_files->end()) {
            result = std::make_shared<QPDFFileSpecObjectHelper>(i->second);
        }
    }
    return result;
}